

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int spng_encode_chunks(spng_ctx *ctx)

{
  spng__decode_plte *data_00;
  spng_splt *__s;
  uint8_t uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  spng_splt *psVar5;
  spng_text2 *psVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  short sVar9;
  int iVar10;
  spng_chunk_bitfield sVar11;
  uint uVar12;
  spng_state sVar13;
  spng__decode_plte *psVar14;
  size_t sVar15;
  uchar *puVar16;
  size_t sVar17;
  ulong uVar18;
  uint16_t uVar19;
  uint8_t *puVar20;
  Bytef *pBVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  uchar *data;
  uLongf dest_len;
  uchar *cdata;
  uchar *local_90;
  Bytef *local_88;
  ulong local_80;
  size_t local_78;
  size_t local_70;
  ulong local_68;
  uchar *local_60;
  z_stream *local_58;
  ulong local_50;
  ulong local_48;
  spng__zlib_options *local_40;
  uint8_t *local_38;
  
  if (ctx == (spng_ctx *)0x0) {
    return 1;
  }
  sVar13 = ctx->state;
  if (sVar13 == SPNG_STATE_INVALID) {
    return 0x46;
  }
  if (sVar13 == SPNG_STATE_INIT) {
    return 0x53;
  }
  if ((ctx->field_0xcc & 0x10) == 0) {
    return 0x51;
  }
  if (sVar13 < SPNG_STATE_FIRST_IDAT) {
    if (((uint)ctx->stored & 1) == 0) {
      return 0xf;
    }
    iVar10 = write_data(ctx,spng_signature,8);
    if (iVar10 == 0) {
      data_00 = &ctx->decode_plte;
      uVar12 = (ctx->ihdr).width;
      uVar4 = (ctx->ihdr).height;
      (ctx->decode_plte).align_this =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      (ctx->decode_plte).rgba[1] =
           (spng_plte_entry)
           (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
      uVar1 = (ctx->ihdr).color_type;
      uVar7 = (ctx->ihdr).compression_method;
      uVar8 = (ctx->ihdr).filter_method;
      *(uint8_t *)((long)&ctx->decode_plte + 8) = (ctx->ihdr).bit_depth;
      *(uint8_t *)((long)&ctx->decode_plte + 9) = uVar1;
      *(uint8_t *)((long)&ctx->decode_plte + 10) = uVar7;
      *(uint8_t *)((long)&ctx->decode_plte + 0xb) = uVar8;
      (ctx->decode_plte).rgba[3].red = (ctx->ihdr).interlace_method;
      iVar10 = write_chunk(ctx,"IHDR",data_00,0xd);
      if (iVar10 == 0) {
        sVar11 = ctx->stored;
        if (((uint)sVar11 & 4) != 0) {
          uVar12 = (ctx->chrm_int).white_point_x;
          uVar4 = (ctx->chrm_int).white_point_y;
          (ctx->decode_plte).align_this =
               uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
          (ctx->decode_plte).rgba[1] =
               (spng_plte_entry)
               (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
          uVar12 = (ctx->chrm_int).red_x;
          (ctx->decode_plte).rgba[2] =
               (spng_plte_entry)
               (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18)
          ;
          uVar12 = (ctx->chrm_int).red_y;
          (ctx->decode_plte).rgba[3] =
               (spng_plte_entry)
               (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18)
          ;
          uVar12 = (ctx->chrm_int).green_x;
          (ctx->decode_plte).rgba[4] =
               (spng_plte_entry)
               (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18)
          ;
          uVar12 = (ctx->chrm_int).green_y;
          (ctx->decode_plte).rgba[5] =
               (spng_plte_entry)
               (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18)
          ;
          uVar12 = (ctx->chrm_int).blue_x;
          (ctx->decode_plte).rgba[6] =
               (spng_plte_entry)
               (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18)
          ;
          uVar12 = (ctx->chrm_int).blue_y;
          (ctx->decode_plte).rgba[7] =
               (spng_plte_entry)
               (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18)
          ;
          iVar10 = write_chunk(ctx,"cHRM",data_00,0x20);
          if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
          sVar11 = ctx->stored;
        }
        if (((uint)sVar11 & 0x10) != 0) {
          uVar12 = ctx->gama;
          (ctx->decode_plte).align_this =
               uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
          iVar10 = write_chunk(ctx,"gAMA",data_00,4);
          if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
          sVar11 = ctx->stored;
        }
        if (((uint)sVar11 & 8) == 0) {
LAB_00106cc9:
          if (((uint)sVar11 & 0x20) != 0) {
            iVar10 = 0x50;
            switch((ctx->ihdr).color_type) {
            case '\0':
              (ctx->decode_plte).rgba[0].red = (ctx->sbit).grayscale_bits;
              sVar17 = 1;
              break;
            default:
              goto switchD_00106cf1_caseD_1;
            case '\x02':
            case '\x03':
              (ctx->decode_plte).rgba[0].red = (ctx->sbit).red_bits;
              *(undefined2 *)((long)&ctx->decode_plte + 1) = *(undefined2 *)&(ctx->sbit).green_bits;
              sVar17 = 3;
              break;
            case '\x04':
              uVar1 = (ctx->sbit).alpha_bits;
              (ctx->decode_plte).rgba[0].red = (ctx->sbit).grayscale_bits;
              (ctx->decode_plte).rgba[0].green = uVar1;
              sVar17 = 2;
              break;
            case '\x06':
              uVar1 = (ctx->sbit).green_bits;
              uVar7 = (ctx->sbit).blue_bits;
              uVar8 = (ctx->sbit).alpha_bits;
              *(uint8_t *)&ctx->decode_plte = (ctx->sbit).red_bits;
              *(uint8_t *)((long)&ctx->decode_plte + 1) = uVar1;
              *(uint8_t *)((long)&ctx->decode_plte + 2) = uVar7;
              *(uint8_t *)((long)&ctx->decode_plte + 3) = uVar8;
              sVar17 = 4;
            }
            iVar10 = write_chunk(ctx,"sBIT",data_00,sVar17);
            if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
            sVar11 = ctx->stored;
          }
          if (((((uint)sVar11 & 0x40) == 0) ||
              (iVar10 = write_chunk(ctx,"sRGB",&ctx->srgb_rendering_intent,1), iVar10 == 0)) &&
             (iVar10 = write_unknown_chunks(ctx,SPNG_AFTER_IHDR), iVar10 == 0)) {
            sVar11 = ctx->stored;
            if (((uint)sVar11 & 2) != 0) {
              uVar12 = (ctx->plte).n_entries;
              if ((ulong)uVar12 != 0) {
                puVar20 = &(ctx->plte).entries[0].blue;
                uVar23 = 0;
                do {
                  data_00->rgb[uVar23 & 0xffffffff] = ((spng_plte_entry *)(puVar20 + -2))->red;
                  data_00->rgb[(int)uVar23 + 1] = puVar20[-1];
                  data_00->rgb[(int)uVar23 + 2] = *puVar20;
                  uVar23 = uVar23 + 3;
                  puVar20 = puVar20 + 4;
                } while ((ulong)uVar12 * 3 != uVar23);
              }
              iVar10 = write_chunk(ctx,"PLTE",data_00,(ulong)(uVar12 * 3));
              if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
              sVar11 = ctx->stored;
            }
            if (((uint)sVar11 >> 8 & 1) != 0) {
              iVar10 = 0x50;
              switch((ctx->ihdr).color_type) {
              case '\0':
              case '\x04':
                uVar19 = (ctx->bkgd).gray;
                (ctx->decode_plte).rgba[0].red = (uint8_t)(uVar19 >> 8);
                sVar17 = 2;
                psVar14 = (spng__decode_plte *)((long)&ctx->decode_plte + 1);
                break;
              default:
                goto switchD_00106cf1_caseD_1;
              case '\x02':
              case '\x06':
                uVar2 = (ctx->bkgd).red;
                uVar3 = (ctx->bkgd).green;
                *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
                *(ushort *)((long)&ctx->decode_plte + 2) = uVar3 << 8 | uVar3 >> 8;
                uVar19 = (ctx->bkgd).blue;
                (ctx->decode_plte).rgba[1].red = (uint8_t)(uVar19 >> 8);
                sVar17 = 6;
                psVar14 = (spng__decode_plte *)((long)&ctx->decode_plte + 5);
                break;
              case '\x03':
                uVar19 = (ctx->bkgd).plte_index;
                sVar17 = 1;
                psVar14 = data_00;
              }
              psVar14->rgba[0].red = (uint8_t)uVar19;
              iVar10 = write_chunk(ctx,"bKGD",data_00,sVar17);
              if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
              sVar11 = ctx->stored;
            }
            if (((uint)sVar11 >> 9 & 1) != 0) {
              uVar12 = (ctx->plte).n_entries;
              if ((ulong)uVar12 != 0) {
                uVar23 = 0;
                do {
                  uVar2 = *(ushort *)((long)(ctx->hist).frequency + uVar23);
                  *(ushort *)(ctx->trns_px + (uVar23 & 0xffffffff) + 8) = uVar2 << 8 | uVar2 >> 8;
                  uVar23 = uVar23 + 2;
                } while ((ulong)uVar12 * 2 != uVar23);
              }
              iVar10 = write_chunk(ctx,"hIST",data_00,(ulong)(uVar12 * 2));
              if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
              sVar11 = ctx->stored;
            }
            if (((uint)sVar11 >> 10 & 1) != 0) {
              uVar1 = (ctx->ihdr).color_type;
              if (uVar1 == '\x03') {
                sVar17 = (size_t)(ctx->trns).n_type3_entries;
                psVar14 = (spng__decode_plte *)(ctx->trns).type3_alpha;
              }
              else {
                psVar14 = data_00;
                if (uVar1 == '\x02') {
                  uVar2 = (ctx->trns).red;
                  uVar3 = (ctx->trns).green;
                  *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
                  *(ushort *)((long)&ctx->decode_plte + 2) = uVar3 << 8 | uVar3 >> 8;
                  uVar2 = (ctx->trns).blue;
                  *(ushort *)((long)&ctx->decode_plte + 4) = uVar2 << 8 | uVar2 >> 8;
                  sVar17 = 6;
                }
                else {
                  if (uVar1 != '\0') goto LAB_00107157;
                  uVar2 = (ctx->trns).gray;
                  *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
                  sVar17 = 2;
                }
              }
              iVar10 = write_chunk(ctx,"tRNS",psVar14,sVar17);
              if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
              sVar11 = ctx->stored;
            }
LAB_00107157:
            if (((uint)sVar11 >> 0xb & 1) != 0) {
              uVar12 = (ctx->phys).ppu_x;
              uVar4 = (ctx->phys).ppu_y;
              (ctx->decode_plte).align_this =
                   uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                   uVar12 << 0x18;
              (ctx->decode_plte).rgba[1] =
                   (spng_plte_entry)
                   (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18)
              ;
              (ctx->decode_plte).rgba[2].red = (ctx->phys).unit_specifier;
              iVar10 = write_chunk(ctx,"pHYs",data_00,9);
              if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
              sVar11 = ctx->stored;
            }
            if ((((uint)sVar11 >> 0xc & 1) != 0) && (local_90 = (uchar *)0x0, ctx->n_splt != 0)) {
              uVar23 = 0;
              do {
                psVar5 = ctx->splt_list;
                __s = psVar5 + uVar23;
                local_80 = uVar23;
                sVar15 = strlen(__s->name);
                local_88 = (Bytef *)(sVar15 + 1);
                uVar1 = psVar5[uVar23].sample_depth;
                if (uVar1 == '\b') {
                  iVar10 = 6;
LAB_00107218:
                  pBVar21 = local_88 + (ulong)(iVar10 * __s->n_entries) + 1;
                }
                else {
                  pBVar21 = local_88;
                  if (uVar1 == '\x10') {
                    iVar10 = 10;
                    goto LAB_00107218;
                  }
                }
                iVar10 = write_header(ctx,"sPLT",(size_t)pBVar21,&local_90);
                if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
                memcpy(local_90,__s,(size_t)local_88);
                puVar16 = local_90 + sVar15 + 2;
                uVar1 = __s->sample_depth;
                local_90[sVar15 + 1] = uVar1;
                if (uVar1 == '\b') {
                  if (__s->n_entries != 0) {
                    uVar12 = 3;
                    lVar24 = 0;
                    uVar23 = 0;
                    do {
                      puVar16[uVar12 - 3] = *(uchar *)((long)&__s->entries->red + lVar24);
                      puVar16[uVar12 - 2] = *(uchar *)((long)&__s->entries->green + lVar24);
                      puVar16[uVar12 - 1] = *(uchar *)((long)&__s->entries->blue + lVar24);
                      puVar16[uVar12] = *(uchar *)((long)&__s->entries->alpha + lVar24);
                      uVar2 = *(ushort *)((long)&__s->entries->frequency + lVar24);
                      *(ushort *)(local_90 + (ulong)(uVar12 - 3) + sVar15 + 6) =
                           uVar2 << 8 | uVar2 >> 8;
                      uVar23 = uVar23 + 1;
                      lVar24 = lVar24 + 10;
                      uVar12 = uVar12 + 6;
                    } while (uVar23 < __s->n_entries);
                  }
                }
                else if ((uVar1 == '\x10') && (__s->n_entries != 0)) {
                  uVar23 = 0;
                  uVar18 = 0;
                  do {
                    uVar22 = uVar23 & 0xffffffff;
                    uVar2 = *(ushort *)((long)&__s->entries->red + uVar23);
                    *(ushort *)(puVar16 + uVar22) = uVar2 << 8 | uVar2 >> 8;
                    uVar2 = *(ushort *)((long)&__s->entries->green + uVar23);
                    *(ushort *)(local_90 + uVar22 + sVar15 + 4) = uVar2 << 8 | uVar2 >> 8;
                    uVar2 = *(ushort *)((long)&__s->entries->blue + uVar23);
                    *(ushort *)(local_90 + uVar22 + sVar15 + 6) = uVar2 << 8 | uVar2 >> 8;
                    uVar2 = *(ushort *)((long)&__s->entries->alpha + uVar23);
                    *(ushort *)(local_90 + uVar22 + sVar15 + 8) = uVar2 << 8 | uVar2 >> 8;
                    uVar2 = *(ushort *)((long)&__s->entries->frequency + uVar23);
                    *(ushort *)(local_90 + uVar22 + sVar15 + 10) = uVar2 << 8 | uVar2 >> 8;
                    uVar18 = uVar18 + 1;
                    uVar23 = uVar23 + 10;
                  } while (uVar18 < __s->n_entries);
                }
                local_90 = puVar16;
                iVar10 = finish_chunk(ctx);
                if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
                uVar23 = local_80 + 1;
              } while (uVar23 < ctx->n_splt);
              sVar11 = ctx->stored;
            }
            if (((uint)sVar11 >> 0xd & 1) != 0) {
              uVar2 = (ctx->time).year;
              *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
              *(undefined4 *)((long)&ctx->decode_plte + 2) = *(undefined4 *)&(ctx->time).month;
              (ctx->decode_plte).rgba[1].blue = (ctx->time).second;
              iVar10 = write_chunk(ctx,"tIME",data_00,7);
              if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
              sVar11 = ctx->stored;
            }
            if ((sVar11._0_1_ < '\0') && (local_90 = (uchar *)0x0, ctx->n_text != 0)) {
              local_40 = &ctx->text_options;
              local_58 = &ctx->zstream;
              lVar24 = 0x30;
              local_48 = 0;
              do {
                psVar6 = ctx->text_list;
                iVar10 = *(int *)(psVar6->user_keyword_storage + lVar24 + -0x70);
                sVar15 = strlen(*(char **)(psVar6->user_keyword_storage + lVar24 + -0x68));
                local_80 = strlen(*(char **)(psVar6->user_keyword_storage + lVar24 + -0x60));
                local_68 = sVar15 + 1;
                local_38 = *(uint8_t **)(&DAT_0010fdd0 + (long)iVar10 * 8);
                if ((long)iVar10 == 3) {
                  iVar10 = 0x50;
                  if ((*(char **)(psVar6->user_keyword_storage + lVar24 + -0x48) == (char *)0x0) ||
                     (local_88 = *(Bytef **)(psVar6->user_keyword_storage + lVar24 + -0x40),
                     local_88 == (Bytef *)0x0)) goto switchD_00106cf1_caseD_1;
                  local_70 = strlen(*(char **)(psVar6->user_keyword_storage + lVar24 + -0x48));
                  iVar10 = 3;
                  uVar23 = local_70 + local_68;
                  if (CARRY8(local_70,local_68)) goto switchD_00106cf1_caseD_1;
                  local_78 = strlen((char *)local_88);
                  uVar18 = uVar23 + local_78;
                  if ((CARRY8(uVar23,local_78)) || (0xfffffffffffffffb < uVar18))
                  goto switchD_00106cf1_caseD_1;
                  uVar18 = uVar18 + 4;
                }
                else {
                  uVar18 = local_68;
                  if (iVar10 == 2) {
                    uVar18 = sVar15 + 2;
                  }
                  local_70 = 0;
                  local_78 = 0;
                }
                if (psVar6->user_keyword_storage[lVar24 + -0x50] == '\0') {
                  local_88 = (Bytef *)0x0;
                  local_50 = 0;
                  uVar23 = local_80;
                }
                else {
                  iVar10 = spng__deflate_init(ctx,local_40);
                  if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
                  sVar17 = deflateBound(local_58,local_80);
                  local_88 = (Bytef *)(*(ctx->alloc).malloc_fn)(sVar17);
                  if (local_88 == (Bytef *)0x0) goto LAB_001077e1;
                  (ctx->zstream).next_in =
                       *(Bytef **)(psVar6->user_keyword_storage + lVar24 + -0x60);
                  (ctx->zstream).avail_in = (uInt)local_80;
                  (ctx->zstream).next_out = local_88;
                  (ctx->zstream).avail_out = (uInt)sVar17;
                  iVar10 = deflate(local_58,4);
                  pBVar21 = local_88;
                  if (iVar10 != 1) goto LAB_00106dae;
                  local_50 = (ctx->zstream).total_out;
                  uVar23 = local_50;
                }
                if (CARRY8(uVar18,uVar23)) {
                  iVar10 = 3;
                  goto switchD_00106cf1_caseD_1;
                }
                iVar10 = write_header(ctx,local_38,uVar18 + uVar23,&local_90);
                uVar23 = local_68;
                pBVar21 = local_88;
                if (iVar10 != 0) goto LAB_00106e0c;
                memcpy(local_90,*(void **)(psVar6->user_keyword_storage + lVar24 + -0x68),local_68);
                local_90 = local_90 + uVar23;
                if (*(int *)(psVar6->user_keyword_storage + lVar24 + -0x70) == 2) {
                  *local_90 = '\0';
                  local_90 = local_90 + 1;
                }
                else if (*(int *)(psVar6->user_keyword_storage + lVar24 + -0x70) == 3) {
                  *local_90 = psVar6->user_keyword_storage[lVar24 + -0x50];
                  local_90[1] = '\0';
                  local_90 = local_90 + 2;
                  sVar15 = local_70 + 1;
                  memcpy(local_90,*(void **)(psVar6->user_keyword_storage + lVar24 + -0x48),sVar15);
                  local_90 = local_90 + sVar15;
                  sVar15 = local_78 + 1;
                  memcpy(local_90,*(void **)(psVar6->user_keyword_storage + lVar24 + -0x40),sVar15);
                  local_90 = local_90 + sVar15;
                }
                uVar23 = local_50;
                pBVar21 = local_88;
                if (psVar6->user_keyword_storage[lVar24 + -0x50] == '\0') {
                  uVar23 = local_80;
                  pBVar21 = *(Bytef **)(psVar6->user_keyword_storage + lVar24 + -0x60);
                }
                memcpy(local_90,pBVar21,uVar23);
                (*(ctx->alloc).free_fn)(local_88);
                iVar10 = finish_chunk(ctx);
                if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
                local_48 = local_48 + 1;
                lVar24 = lVar24 + 0x90;
              } while (local_48 < ctx->n_text);
              sVar11 = ctx->stored;
            }
            sVar9 = sVar11._0_2_;
            if (((uint)sVar11 >> 0xe & 1) != 0) {
              uVar12 = (ctx->offs).x;
              uVar4 = (ctx->offs).y;
              (ctx->decode_plte).align_this =
                   uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                   uVar12 << 0x18;
              (ctx->decode_plte).rgba[1] =
                   (spng_plte_entry)
                   (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18)
              ;
              (ctx->decode_plte).rgba[2].red = (ctx->offs).unit_specifier;
              iVar10 = write_chunk(ctx,"oFFs",data_00,9);
              if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
              sVar9 = SUB42(ctx->stored,0);
            }
            if (((-1 < sVar9) ||
                (iVar10 = write_chunk(ctx,"eXIf",(ctx->exif).data,(ctx->exif).length), iVar10 == 0))
               && (iVar10 = write_unknown_chunks(ctx,SPNG_AFTER_PLTE), iVar10 == 0)) {
              sVar13 = SPNG_STATE_FIRST_IDAT;
              goto LAB_00106d47;
            }
          }
        }
        else {
          local_90 = (uchar *)compressBound((ctx->iccp).profile_len);
          pBVar21 = (Bytef *)(*(ctx->alloc).malloc_fn)((size_t)local_90);
          if (pBVar21 == (Bytef *)0x0) {
LAB_001077e1:
            iVar10 = 2;
          }
          else {
            iVar10 = compress2(pBVar21,&local_90,(ctx->iccp).profile,(ctx->iccp).profile_len,
                               0xffffffff);
            if (iVar10 == 0) {
              sVar15 = strlen((ctx->iccp).profile_name);
              iVar10 = 3;
              if (!CARRY8(sVar15 + 2,(ulong)local_90)) {
                local_60 = (uchar *)0x0;
                iVar10 = write_header(ctx,"iCCP",(size_t)(local_90 + sVar15 + 2),&local_60);
                if (iVar10 == 0) {
                  memcpy(local_60,&ctx->iccp,sVar15 + 1);
                  local_60[sVar15 + 1] = '\0';
                  memcpy(local_60 + sVar15 + 2,pBVar21,(size_t)local_90);
                  (*(ctx->alloc).free_fn)(pBVar21);
                  iVar10 = finish_chunk(ctx);
                  if (iVar10 == 0) {
                    sVar11 = ctx->stored;
                    goto LAB_00106cc9;
                  }
                }
                else {
LAB_00106e0c:
                  (*(ctx->alloc).free_fn)(pBVar21);
                }
              }
            }
            else {
LAB_00106dae:
              (*(ctx->alloc).free_fn)(pBVar21);
              iVar10 = 0x40;
            }
          }
        }
      }
    }
switchD_00106cf1_caseD_1:
    ctx->state = SPNG_STATE_INVALID;
  }
  else {
    if (sVar13 != SPNG_STATE_FIRST_IDAT) {
      if (sVar13 != SPNG_STATE_EOI) {
        return 0x54;
      }
      iVar10 = write_chunks_after_idat(ctx);
      if (iVar10 != 0) goto switchD_00106cf1_caseD_1;
      sVar13 = SPNG_STATE_IEND;
LAB_00106d47:
      ctx->state = sVar13;
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int spng_encode_chunks(spng_ctx *ctx)
{
    if(ctx == NULL) return 1;
    if(!ctx->state) return SPNG_EBADSTATE;
    if(ctx->state < SPNG_STATE_OUTPUT) return SPNG_ENODST;
    if(!ctx->encode_only) return SPNG_ECTXTYPE;

    int ret = 0;

    if(ctx->state < SPNG_STATE_FIRST_IDAT)
    {
        if(!ctx->stored.ihdr) return SPNG_ENOIHDR;

        ret = write_chunks_before_idat(ctx);
        if(ret) return encode_err(ctx, ret);

        ctx->state = SPNG_STATE_FIRST_IDAT;
    }
    else if(ctx->state == SPNG_STATE_FIRST_IDAT)
    {
        return 0;
    }
    else if(ctx->state == SPNG_STATE_EOI)
    {
        ret = write_chunks_after_idat(ctx);
        if(ret) return encode_err(ctx, ret);

        ctx->state = SPNG_STATE_IEND;
    }
    else return SPNG_EOPSTATE;

    return 0;
}